

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastops_ut.cpp
# Opt level: O2

void TestFunc<TAvxTanh<false,true>,TTanhCompare<false,true>,double>
               (mt19937_64 *rng,TTestExpOpts opts)

{
  result_type_conflict rVar1;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *__urng;
  ulong uVar2;
  pointer pcVar3;
  ostream *poVar4;
  FastOpsTestException *pFVar5;
  double *pdVar6;
  uint uVar7;
  double *pdVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  string local_270;
  double *local_250;
  double *local_248;
  ulong local_240;
  double local_238;
  undefined8 uStack_230;
  double *local_220;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *local_218;
  double *local_210;
  ulong local_208;
  long local_200;
  vector<char,_std::allocator<char>_> outV;
  vector<char,_std::allocator<char>_> inV;
  uniform_real_distribution<double> local_1b8;
  ostringstream out;
  
  std::vector<char,_std::allocator<char>_>::vector
            (&inV,(opts.PadSize + opts.VecSize) * 8 + 0x20,(allocator_type *)&out);
  std::vector<char,_std::allocator<char>_>::vector
            (&outV,(opts.PadSize + opts.VecSize) * 8 + 0x40,(allocator_type *)&out);
  local_1b8._M_param._M_a._0_4_ = 0;
  local_1b8._M_param._M_a._4_4_ = 0;
  local_1b8._M_param._M_b._0_4_ = 0;
  local_1b8._M_param._M_b._4_4_ = 0x3ff00000;
  uVar2 = opts.PadSize * 4 & 0xfffffffffffffff8;
  pdVar8 = (double *)
           inV.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  do {
    pdVar10 = pdVar8;
    pdVar8 = (double *)((long)pdVar10 + 1);
  } while (((int)pdVar10 + (int)uVar2 & 0x1f) != opts.InputAlignBytes);
  local_210 = (double *)
              (outV.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start + -1);
  pcVar3 = outV.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start + uVar2;
  do {
    uVar7 = (uint)pcVar3;
    local_210 = (double *)((long)local_210 + 1);
    pcVar3 = pcVar3 + 1;
  } while ((uVar7 & 0x1f) != opts.OutputAlignBytes);
  local_208 = opts.PadSize >> 1;
  local_250 = local_210 + local_208;
  local_248 = pdVar10 + local_208;
  if (opts.Inplace != false) {
    local_248 = local_250;
  }
  local_200 = (long)pdVar10 + 1 + local_208 * 8 + -1;
  uVar2 = 0;
  local_220 = pdVar10;
  local_218 = rng;
  do {
    __urng = local_218;
    pdVar8 = local_248;
    if (opts.N / opts.VecSize + 1 <= uVar2) {
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&outV.super__Vector_base<char,_std::allocator<char>_>);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&inV.super__Vector_base<char,_std::allocator<char>_>);
      return;
    }
    local_240 = uVar2;
    memset(inV.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start,0,
           (long)inV.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                 ._M_finish -
           (long)inV.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                 ._M_start);
    memset(outV.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start,0,
           (long)outV.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)outV.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
    for (uVar2 = 0; uVar2 < opts.VecSize; uVar2 = uVar2 + 1) {
      if (opts.IsRandom == true) {
        rVar1 = std::uniform_real_distribution<double>::operator()(&local_1b8,__urng);
        dVar19 = rVar1 * (double)(opts.Max - opts.Min) + (double)opts.Min;
      }
      else {
        local_238 = (double)CONCAT44(local_238._4_4_,opts.Max);
        rVar1 = std::uniform_real_distribution<double>::operator()(&local_1b8,__urng);
        lVar11 = opts.VecSize * local_240 + uVar2;
        auVar17._8_4_ = (int)((ulong)lVar11 >> 0x20);
        auVar17._0_8_ = lVar11;
        auVar17._12_4_ = 0x45300000;
        auVar18._8_4_ = opts.N._4_4_;
        auVar18._0_8_ = opts.N;
        auVar18._12_4_ = 0x45300000;
        dVar19 = (auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)opts.N) - 4503599627370496.0);
        dVar19 = (rVar1 + rVar1 + -1.0) / dVar19 +
                 (double)opts.Min +
                 (double)(local_238._0_4_ - opts.Min) *
                 (((auVar17._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) / dVar19);
        pdVar8 = local_248;
      }
      if ((1 < opts.Func - Sigmoid) && (opts.Func != Exp)) {
        if (opts.Func != Log) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
          poVar4 = std::operator<<((ostream *)&out,"assertion failed ");
          poVar4 = std::operator<<(poVar4,"false");
          poVar4 = std::operator<<(poVar4," at ");
          poVar4 = std::operator<<(poVar4,"TestFunc");
          poVar4 = std::operator<<(poVar4,", ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/yandex[P]fastops/fastops/ut/fastops_ut.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          std::ostream::operator<<(poVar4,0x7f);
          pFVar5 = (FastOpsTestException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          FastOpsTestException::FastOpsTestException(pFVar5,&local_270);
          __cxa_throw(pFVar5,&FastOpsTestException::typeinfo,
                      FastOpsTestException::~FastOpsTestException);
        }
        dVar19 = exp(dVar19);
      }
      pdVar8[uVar2] = dVar19;
      *(double *)(local_200 + uVar2 * 8) = dVar19;
    }
    NFastOps::TanhAvx<false,true>(pdVar8,opts.VecSize,local_250);
    lVar11 = opts.PadSize + opts.VecSize;
    if (opts.Inplace == false) {
      pdVar6 = local_220;
      lVar9 = lVar11;
      while (bVar12 = lVar9 != 0, lVar9 = lVar9 + -1, bVar12) {
        if ((pdVar6 < pdVar8 || pdVar8 + opts.VecSize <= pdVar6) &&
           ((*pdVar6 != 0.0 || (NAN(*pdVar6))))) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
          poVar4 = std::operator<<((ostream *)&out,"assertion failed ");
          poVar4 = std::operator<<(poVar4,"ReadUnaligned<T>(inDataStart + j) == 0");
          poVar4 = std::operator<<(poVar4," at ");
          poVar4 = std::operator<<(poVar4,"TestFunc");
          poVar4 = std::operator<<(poVar4,", ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/yandex[P]fastops/fastops/ut/fastops_ut.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          std::ostream::operator<<(poVar4,0x8a);
          pFVar5 = (FastOpsTestException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          FastOpsTestException::FastOpsTestException(pFVar5,&local_270);
          __cxa_throw(pFVar5,&FastOpsTestException::typeinfo,
                      FastOpsTestException::~FastOpsTestException);
        }
        pdVar6 = pdVar6 + 1;
      }
    }
    pdVar8 = local_250 + opts.VecSize;
    lVar9 = 0;
    pdVar6 = local_210;
    while (bVar12 = lVar11 != 0, lVar11 = lVar11 + -1, bVar12) {
      if ((lVar9 < (long)local_208) || (pdVar8 <= pdVar6)) {
        if ((*pdVar6 != 0.0) || (NAN(*pdVar6))) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
          poVar4 = std::operator<<((ostream *)&out,"assertion failed ");
          poVar4 = std::operator<<(poVar4,"ReadUnaligned<T>(outDataStart + j) == 0");
          poVar4 = std::operator<<(poVar4," at ");
          poVar4 = std::operator<<(poVar4,"TestFunc");
          poVar4 = std::operator<<(poVar4,", ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/yandex[P]fastops/fastops/ut/fastops_ut.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          std::ostream::operator<<(poVar4,0x91);
          pFVar5 = (FastOpsTestException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          FastOpsTestException::FastOpsTestException(pFVar5,&local_270);
          __cxa_throw(pFVar5,&FastOpsTestException::typeinfo,
                      FastOpsTestException::~FastOpsTestException);
        }
      }
      else {
        switch(opts.Func) {
        case Exp:
          dVar19 = exp(pdVar10[lVar9]);
          uVar13 = SUB84(dVar19,0);
          uVar14 = (undefined4)((ulong)dVar19 >> 0x20);
          uVar15 = extraout_XMM0_Dc;
          uVar16 = extraout_XMM0_Dd;
          break;
        case Log:
          dVar19 = log(pdVar10[lVar9]);
          uVar13 = SUB84(dVar19,0);
          uVar14 = (undefined4)((ulong)dVar19 >> 0x20);
          uVar15 = extraout_XMM0_Dc_01;
          uVar16 = extraout_XMM0_Dd_01;
          break;
        case Sigmoid:
          dVar19 = exp(-pdVar10[lVar9]);
          local_238 = 1.0 / (dVar19 + 1.0);
          uStack_230 = 0;
          goto LAB_0015bc7a;
        case Tanh:
          dVar19 = tanh(pdVar10[lVar9]);
          uVar13 = SUB84(dVar19,0);
          uVar14 = (undefined4)((ulong)dVar19 >> 0x20);
          uVar15 = extraout_XMM0_Dc_00;
          uVar16 = extraout_XMM0_Dd_00;
          break;
        default:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
          poVar4 = std::operator<<((ostream *)&out,"assertion failed ");
          poVar4 = std::operator<<(poVar4,"false");
          poVar4 = std::operator<<(poVar4," at ");
          poVar4 = std::operator<<(poVar4,"TestFunc");
          poVar4 = std::operator<<(poVar4,", ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/yandex[P]fastops/fastops/ut/fastops_ut.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          std::ostream::operator<<(poVar4,0xac);
          pFVar5 = (FastOpsTestException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          FastOpsTestException::FastOpsTestException(pFVar5,&local_270);
          __cxa_throw(pFVar5,&FastOpsTestException::typeinfo,
                      FastOpsTestException::~FastOpsTestException);
        }
        local_238 = (double)CONCAT44(uVar14,uVar13);
        uStack_230 = CONCAT44(uVar16,uVar15);
LAB_0015bc7a:
        dVar19 = *pdVar6;
        bVar12 = TTanhCompare<false,_true>::Compare(pdVar10[lVar9],local_238,dVar19);
        if (!bVar12) {
          poVar4 = std::ostream::_M_insert<double>(pdVar10[lVar9]);
          std::operator<<(poVar4,"\t");
          poVar4 = std::ostream::_M_insert<double>(local_238);
          std::operator<<(poVar4,"\t");
          poVar4 = std::ostream::_M_insert<double>(dVar19);
          std::operator<<(poVar4,"\t");
          poVar4 = std::ostream::_M_insert<double>
                             (ABS(dVar19 - local_238) / (ABS(local_238) + 1e-100));
          std::endl<char,std::char_traits<char>>(poVar4);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
          poVar4 = std::operator<<((ostream *)&out,"assertion failed ");
          poVar4 = std::operator<<(poVar4,"false");
          poVar4 = std::operator<<(poVar4," at ");
          poVar4 = std::operator<<(poVar4,"TestFunc");
          poVar4 = std::operator<<(poVar4,", ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/yandex[P]fastops/fastops/ut/fastops_ut.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          std::ostream::operator<<(poVar4,0xb1);
          pFVar5 = (FastOpsTestException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          FastOpsTestException::FastOpsTestException(pFVar5,&local_270);
          __cxa_throw(pFVar5,&FastOpsTestException::typeinfo,
                      FastOpsTestException::~FastOpsTestException);
        }
      }
      lVar9 = lVar9 + 1;
      pdVar6 = pdVar6 + 1;
    }
    uVar2 = local_240 + 1;
  } while( true );
}

Assistant:

void TestFunc(std::mt19937_64& rng, TTestExpOpts opts) {
    std::vector<char> inV((opts.VecSize + opts.PadSize) * sizeof(T) + 32);
    std::vector<char> outV((opts.VecSize + opts.PadSize + 4) * sizeof(T) + 32);
    std::uniform_real_distribution<> dis(0, 1.0);

    size_t padOffset = opts.PadSize / 2;
    padOffset *= sizeof(T);

    char* inVCharData = inV.data();
    char* outVCharData = outV.data();
    while ((size_t)(inVCharData + padOffset) % 32 != opts.InputAlignBytes) {
        ++inVCharData;
    }
    while ((size_t)(outVCharData + padOffset) % 32 != opts.OutputAlignBytes) {
        ++outVCharData;
    }

    T* inDataStart = (T*)inVCharData;
    T* inData = inDataStart + opts.PadSize / 2;
    T* origInData = inData;
    T* outDataStart = (T*)outVCharData;
    T* outData = outDataStart + opts.PadSize / 2;

    if (opts.Inplace) {
        inData = outData;
    }

    for (size_t i = 0; i < opts.N / opts.VecSize + 1; ++i) {
        std::memset(inV.data(), 0, inV.size());
        std::memset(outV.data(), 0, outV.size());
        for (size_t j = 0; j < opts.VecSize; ++j) {
            T val;
            if (opts.IsRandom) {
                val = dis(rng) * (opts.Max - opts.Min) + opts.Min;
            } else {
                size_t idx = opts.VecSize * i + j;
                val = opts.Min + idx * 1.0 / opts.N * (opts.Max - opts.Min) + (2 * dis(rng) - 1) * 1.0 / opts.N;
            }

            switch (opts.Func) {
                case EFunc::Log:
                    val = exp(val);
                    break;
                case EFunc::Exp:
                case EFunc::Sigmoid:
                case EFunc::Tanh:
                    break;
                default:
                    UNIT_ASSERT(false);
            }

            WriteUnaligned(inData + j, val);
            WriteUnaligned(origInData + j, val);
        }

        TFunc::Apply(inData, opts.VecSize, outData);
        if (!opts.Inplace) {
            for (size_t j = 0; j < opts.VecSize + opts.PadSize; ++j) {
                if (inDataStart + j < inData || inDataStart + j >= inData + opts.VecSize) {
                    UNIT_ASSERT(ReadUnaligned<T>(inDataStart + j) == 0);
                }
            }
        }

        for (size_t j = 0; j < opts.VecSize + opts.PadSize; ++j) {
            if (outDataStart + j < outData || outDataStart + j >= outData + opts.VecSize) {
                UNIT_ASSERT(ReadUnaligned<T>(outDataStart + j) == 0);
            } else {
                size_t j2 = outDataStart + j - outData;
                T trueVal;
                T approxVal;
                switch (opts.Func) {
                    case EFunc::Log: {
                        trueVal = log(ReadUnaligned<T>(origInData + j2));
                        approxVal = ReadUnaligned<T>(outDataStart + j);
                        break;
                    }
                    case EFunc::Exp: {
                        trueVal = exp(ReadUnaligned<T>(origInData + j2));
                        approxVal = ReadUnaligned<T>(outDataStart + j);
                        break;
                    }
                    case EFunc::Sigmoid: {
                        trueVal = 1.0 / (1.0 + exp(-ReadUnaligned<T>(origInData + j2)));
                        approxVal = ReadUnaligned<T>(outDataStart + j);
                        break;
                    }
                    case EFunc::Tanh: {
                        trueVal = tanh(ReadUnaligned<T>(origInData + j2));
                        approxVal = ReadUnaligned<T>(outDataStart + j);
                        break;
                    }
                    default:
                        UNIT_ASSERT(false);
                }

                if (!TCompare::Compare(ReadUnaligned<T>(origInData + j2), trueVal, approxVal)) {
                    std::cerr << ReadUnaligned<T>(origInData + j2) << "\t" << trueVal << "\t" << approxVal << "\t" << GetRelError(trueVal, approxVal) << std::endl;
                    UNIT_ASSERT(false);
                }
            }
        }
    }
}